

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O0

Int __thiscall ipx::BasicLu::_Update(BasicLu *this,double pivot)

{
  reference pvVar1;
  int *d;
  logic_error *this_00;
  ostream *poVar2;
  long in_RDI;
  double pivot_error;
  double max_eta;
  Int status;
  double max_eta_old;
  double in_stack_000001b8;
  double *in_stack_000001c0;
  lu_int *in_stack_000001c8;
  double *in_stack_000001d0;
  lu_int *in_stack_000001d8;
  double *in_stack_000001e0;
  lu_int *in_stack_000001e8;
  lu_int *in_stack_00000200;
  double *in_stack_00000208;
  BasicLu *in_stack_ffffffffffffff30;
  string local_88 [32];
  double local_68;
  string local_60 [32];
  double local_40;
  lu_int local_24;
  value_type local_20;
  Int local_4;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0x5d);
  local_20 = *pvVar1;
  while( true ) {
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809d44);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809d5a);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809d70);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809d89);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809d9f);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809db8);
    d = std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809dce);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809dea);
    local_24 = basiclu_update(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
                              in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,
                              in_stack_00000200,in_stack_00000208,in_stack_000001b8);
    if (local_24 != 1) break;
    Reallocate(in_stack_ffffffffffffff30);
  }
  if ((local_24 != 0) && (local_24 != -6)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"basiclu_update failed");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (local_24 == -6) {
    local_4 = -1;
  }
  else {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0x5d);
    local_40 = *pvVar1;
    if ((10000000000.0 < local_40) && (local_20 < local_40)) {
      poVar2 = Control::Debug(*(Control **)(in_RDI + 0x10),3);
      poVar2 = std::operator<<(poVar2," max eta = ");
      sci2_abi_cxx11_((double)d);
      poVar2 = std::operator<<(poVar2,local_60);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string(local_60);
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0x78);
    local_68 = *pvVar1;
    if (local_68 <= 1e-08) {
      local_4 = 0;
    }
    else {
      poVar2 = Control::Debug(*(Control **)(in_RDI + 0x10),3);
      poVar2 = std::operator<<(poVar2," relative error in new diagonal entry of U = ");
      sci2_abi_cxx11_((double)d);
      poVar2 = std::operator<<(poVar2,local_88);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string(local_88);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

Int BasicLu::_Update(double pivot) {
    double max_eta_old = xstore_[BASICLU_MAX_ETA];
    Int status;
    for (;;) {
        status = basiclu_update(istore_.data(), xstore_.data(),
                                Li_.data(), Lx_.data(),
                                Ui_.data(), Ux_.data(),
                                Wi_.data(), Wx_.data(), pivot);
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK && status !=  BASICLU_ERROR_singular_update)
        throw std::logic_error("basiclu_update failed");
    if (status == BASICLU_ERROR_singular_update)
        return -1;

    // Print a debugging message if a new eta entry is large.
    double max_eta = xstore_[BASICLU_MAX_ETA];
    if (max_eta > 1e10 && max_eta > max_eta_old)
        control_.Debug(3) << " max eta = " << sci2(max_eta) << '\n';

    // stability check
    double pivot_error = xstore_[BASICLU_PIVOT_ERROR];
    if (pivot_error > kFtDiagErrorTol) {
        control_.Debug(3)
            << " relative error in new diagonal entry of U = "
            << sci2(pivot_error) << '\n';
        return 1;
    }
    return 0;
}